

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmElementSegment.cpp
# Opt level: O3

void __thiscall Wasm::WasmElementSegment::Init(WasmElementSegment *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint32 *__s;
  uint32 uVar5;
  
  uVar5 = this->m_numElem;
  if (uVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmElementSegment.cpp"
                       ,0x18,"(m_numElem > 0)","m_numElem > 0");
    if (!bVar2) goto LAB_00f25eb2;
    *puVar4 = 0;
    uVar5 = this->m_numElem;
    if (uVar5 == 0) {
      __s = (uint32 *)&DAT_00000008;
      goto LAB_00f25e95;
    }
  }
  this_00 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
  ;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00f25eb2;
    *puVar4 = 0;
  }
  __s = (uint32 *)
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                  (this_00,(ulong)uVar5 << 2);
  if (__s == (uint32 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00f25eb2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    __s = (uint32 *)0x0;
  }
LAB_00f25e95:
  this->m_elems = __s;
  memset(__s,0xff,(ulong)this->m_numElem << 2);
  return;
}

Assistant:

void WasmElementSegment::Init()
    {
        Assert(m_numElem > 0);
        m_elems = AnewArray(m_alloc, uint32, m_numElem);
        memset(m_elems, Js::Constants::UninitializedValue, m_numElem * sizeof(uint32));
    }